

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

Expression * __thiscall slang::ast::PortSymbol::getInitializer(PortSymbol *this)

{
  Scope *pSVar1;
  SourceLocation rhs;
  Type *this_00;
  Expression *pEVar2;
  PortSymbol *symbol;
  SourceRange assignmentRange;
  LookupLocation LVar3;
  ASTContext context;
  undefined8 in_stack_ffffffffffffff88;
  Scope *local_50;
  uint32_t local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if (this->initializer != (Expression *)0x0) {
    return this->initializer;
  }
  if (this->initializerSyntax == (ExpressionSyntax *)0x0) {
    pEVar2 = (Expression *)0x0;
  }
  else {
    pSVar1 = (this->super_Symbol).parentScope;
    symbol = this;
    if (this->isAnsiPort == false) {
      symbol = (PortSymbol *)this->internalSymbol;
    }
    LVar3 = LookupLocation::after(&symbol->super_Symbol);
    local_48 = LVar3.index;
    local_40 = 0x60;
    local_38 = 0;
    uStack_30 = 0;
    local_28 = 0;
    uStack_20 = 0;
    local_50 = pSVar1;
    this_00 = getType(this);
    rhs = this->initializerLoc;
    assignmentRange.startLoc =
         (SourceLocation)
         ((long)rhs * 0x10 + 0x100000000 >> 4 & 0xfffffffff0000000U | (ulong)(rhs._0_4_ & 0xfffffff)
         );
    assignmentRange.endLoc = (SourceLocation)&local_50;
    pEVar2 = Expression::bindRValue
                       ((Expression *)this_00,(Type *)this->initializerSyntax,
                        (ExpressionSyntax *)rhs,assignmentRange,(ASTContext *)0x0,
                        (bitmask<slang::ast::ASTFlags>)in_stack_ffffffffffffff88);
    this->initializer = pEVar2;
    ASTContext::eval((ConstantValue *)&stack0xffffffffffffff88,(ASTContext *)&local_50,pEVar2,
                     (bitmask<slang::ast::EvalFlags>)0x0);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&stack0xffffffffffffff88);
    pEVar2 = this->initializer;
  }
  return pEVar2;
}

Assistant:

const Expression* PortSymbol::getInitializer() const {
    if (!initializer && initializerSyntax) {
        auto scope = getParentScope();
        SLANG_ASSERT(scope);
        SLANG_ASSERT(internalSymbol);

        // Ansi ports bind their initializers in the context of the port list,
        // while non-ansi ports use the internal symbol context.
        LookupLocation ll;
        if (isAnsiPort)
            ll = LookupLocation::after(*this);
        else
            ll = LookupLocation::after(*internalSymbol);

        ASTContext context(*scope, ll, ASTFlags::NonProcedural | ASTFlags::StaticInitializer);
        initializer = &Expression::bindRValue(getType(), *initializerSyntax,
                                              {initializerLoc, initializerLoc + 1}, context);
        context.eval(*initializer);
    }

    return initializer;
}